

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomResources::read(DomResources *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomResource *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffe48;
  DomResources *in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  parameter_type in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  byte in_stack_fffffffffffffe6f;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe50);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe50);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x19eb70);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
               (size_t)in_stack_fffffffffffffe60);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffe60,
               (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    in_stack_fffffffffffffe6f =
         ::operator==((QStringView *)in_stack_fffffffffffffe50,
                      (QStringView *)in_stack_fffffffffffffe48);
    QString::~QString((QString *)0x19ebd4);
    if ((in_stack_fffffffffffffe6f & 1) == 0) {
      in_stack_fffffffffffffe60 = (parameter_type)CONCAT44(in_register_00000034,__fd);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (size_t)in_stack_fffffffffffffe50);
      ::operator+((QLatin1String *)in_stack_fffffffffffffe50,
                  (QStringView *)in_stack_fffffffffffffe48);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffe48);
      QXmlStreamReader::raiseError(&in_stack_fffffffffffffe60->m_attr_location);
      QString::~QString((QString *)0x19ecaa);
    }
    else {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19ebe8);
      QStringView::toString((QStringView *)in_stack_fffffffffffffe50);
      setAttributeName(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->m_attr_location);
      QString::~QString((QString *)0x19ec2c);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19ecc8);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0019ee83;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 (size_t)in_stack_fffffffffffffe60);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffe60,
                 (QString *)CONCAT44(iVar2,in_stack_fffffffffffffe58));
      __nbytes_00 = 0;
      other.m_data._0_4_ = in_stack_fffffffffffffe78;
      other.m_size = (qsizetype)this;
      other.m_data._4_4_ = in_stack_fffffffffffffe7c;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffe48,other,CaseInsensitive);
      in_stack_fffffffffffffe58 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffe58) ^ 0xff000000;
      QString::~QString((QString *)0x19ed9a);
      if ((in_stack_fffffffffffffe58 & 0x1000000) == 0) {
        in_stack_fffffffffffffe48 = (parameter_type)CONCAT44(in_register_00000034,__fd);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(iVar2,in_stack_fffffffffffffe58),
                   (size_t)in_stack_fffffffffffffe50);
        ::operator+((QLatin1String *)in_stack_fffffffffffffe50,
                    (QStringView *)in_stack_fffffffffffffe48);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffe48);
        QXmlStreamReader::raiseError(&in_stack_fffffffffffffe48->m_attr_location);
        QString::~QString((QString *)0x19ee68);
      }
      else {
        in_stack_fffffffffffffe50 = (DomResources *)operator_new(0x20);
        memset(in_stack_fffffffffffffe50,0,0x20);
        DomResource::DomResource((DomResource *)in_stack_fffffffffffffe50);
        DomResource::read((DomResource *)in_stack_fffffffffffffe50,__fd,__buf_00,__nbytes_00);
        QList<DomResource_*>::append((QList<DomResource_*> *)0x19edf8,in_stack_fffffffffffffe48);
      }
    }
  } while (iVar2 != 5);
LAB_0019ee83:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x19ee90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomResources::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"include"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResource();
                v->read(reader);
                m_include.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}